

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O2

void __thiscall OpenMD::SectionParserManager::~SectionParserManager(SectionParserManager *this)

{
  SectionParserContextList *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->sectionParsers_;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if (p_Var1[1]._M_prev != (_List_node_base *)0x0) {
      (*(code *)(p_Var1[1]._M_prev)->_M_next->_M_prev)();
    }
  }
  std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
  clear(this_00);
  std::__cxx11::
  _List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::_M_clear
            (&this_00->
              super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
            );
  return;
}

Assistant:

SectionParserManager::~SectionParserManager() {
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      delete (i->sectionParser);
    }
    sectionParsers_.clear();
  }